

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O0

int blake2s_update(blake2s_state *S,void *pin,size_t inlen)

{
  size_t sVar1;
  ulong __n;
  size_t fill;
  size_t left;
  uchar *in;
  size_t inlen_local;
  void *pin_local;
  blake2s_state *S_local;
  
  if (inlen != 0) {
    sVar1 = S->buflen;
    __n = 0x40 - sVar1;
    left = (size_t)pin;
    in = (uchar *)inlen;
    if (__n < inlen) {
      S->buflen = 0;
      memcpy(S->buf + sVar1,pin,__n);
      blake2s_increment_counter(S,0x40);
      blake2s_compress(S,S->buf);
      left = __n + (long)pin;
      for (in = (uchar *)(inlen - __n); (uchar *)0x40 < in; in = in + -0x40) {
        blake2s_increment_counter(S,0x40);
        blake2s_compress(S,(uint8_t *)left);
        left = left + 0x40;
      }
    }
    memcpy(S->buf + S->buflen,(void *)left,(size_t)in);
    S->buflen = (size_t)(in + S->buflen);
  }
  return 0;
}

Assistant:

int blake2s_update( blake2s_state *S, const void *pin, size_t inlen )
{
  const unsigned char * in = (const unsigned char *)pin;
  if( inlen > 0 )
  {
    size_t left = S->buflen;
    size_t fill = BLAKE2S_BLOCKBYTES - left;
    if( inlen > fill )
    {
      S->buflen = 0;
      memcpy( S->buf + left, in, fill ); /* Fill buffer */
      blake2s_increment_counter( S, BLAKE2S_BLOCKBYTES );
      blake2s_compress( S, S->buf ); /* Compress */
      in += fill; inlen -= fill;
      while(inlen > BLAKE2S_BLOCKBYTES) {
        blake2s_increment_counter(S, BLAKE2S_BLOCKBYTES);
        blake2s_compress( S, in );
        in += BLAKE2S_BLOCKBYTES;
        inlen -= BLAKE2S_BLOCKBYTES;
      }
    }
    memcpy( S->buf + S->buflen, in, inlen );
    S->buflen += inlen;
  }
  return 0;
}